

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

ssize_t __thiscall serial::Serial::read(Serial *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  ScopedReadLock local_28;
  ScopedReadLock lock;
  size_t size_local;
  uint8_t *buffer_local;
  Serial *this_local;
  
  lock.pimpl_ = (SerialImpl *)__buf;
  ScopedReadLock::ScopedReadLock(&local_28,this->pimpl_);
  sVar1 = SerialImpl::read(this->pimpl_,__fd,lock.pimpl_,__nbytes);
  ScopedReadLock::~ScopedReadLock(&local_28);
  return sVar1;
}

Assistant:

size_t
Serial::read (uint8_t *buffer, size_t size)
{
  ScopedReadLock lock(this->pimpl_);
  return this->pimpl_->read (buffer, size);
}